

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts muladd_floats(FloatParts a,FloatParts b,FloatParts c,int flags,float_status *s)

{
  byte bVar1;
  FloatParts c_00;
  FloatParts b_00;
  _Bool _Var2;
  uint64_t a_00;
  int local_8c;
  ulong uStack_88;
  int shift;
  uint64_t c_lo_1;
  uint64_t c_hi_1;
  uint64_t c_lo;
  uint64_t c_hi;
  int exp_diff;
  int p_exp;
  uint64_t lo;
  uint64_t hi;
  undefined4 uStack_48;
  FloatClass p_class;
  _Bool sign_flip;
  _Bool p_sign;
  _Bool inf_zero;
  FloatParts c_local;
  FloatParts b_local;
  FloatParts a_local;
  undefined8 local_10;
  
  _uStack_48 = c.frac;
  c_local._8_8_ = b.frac;
  a_00 = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  b_local.frac._0_4_ = b.exp;
  b_local.frac._4_1_ = b.cls;
  b_local.frac._5_1_ = b.sign;
  b_local.frac._6_2_ = b._14_2_;
  c_local.frac._0_4_ = c.exp;
  c_local.frac._4_1_ = c.cls;
  c_local.frac._5_1_ = c.sign;
  c_local.frac._6_2_ = c._14_2_;
  hi._7_1_ = (1 << (a_local.frac._4_1_ & 0x1f) | 1 << (b_local.frac._4_1_ & 0x1f)) == 10;
  hi._5_1_ = (flags & 4U) != 0;
  _Var2 = is_nan(a_local.frac._4_1_);
  if (((_Var2) || (_Var2 = is_nan(b_local.frac._4_1_), _Var2)) ||
     (_Var2 = is_nan(c_local.frac._4_1_), _Var2)) {
    b_00.exp = (int)b_local.frac;
    b_00.frac._0_4_ = c_local.exp;
    b_00.frac._4_1_ = c_local.cls;
    b_00.frac._5_1_ = c_local.sign;
    b_00.frac._6_2_ = c_local._14_2_;
    b_00.cls = b_local.frac._4_1_;
    b_00.sign = b_local.frac._5_1_;
    b_00._14_2_ = b_local.frac._6_2_;
    c_00.exp = (int)c_local.frac;
    c_00.frac = _uStack_48;
    c_00.cls = c_local.frac._4_1_;
    c_00.sign = (_Bool)c_local.frac._5_1_;
    c_00._14_2_ = c_local.frac._6_2_;
    join_0x00000010_0x00000000_ = pick_nan_muladd(a,b_00,c_00,(_Bool)(hi._7_1_ & 1),s);
  }
  else if ((hi._7_1_ & 1) == 0) {
    if ((flags & 1U) != 0) {
      c_local.frac._5_1_ = (c_local.frac._5_1_ & 1) != 1;
    }
    hi._6_1_ = (a_local.frac._5_1_ & 1U) != (b_local.frac._5_1_ & 1U);
    if ((flags & 2U) != 0) {
      hi._6_1_ = !(bool)hi._6_1_;
    }
    if ((a_local.frac._4_1_ == float_class_inf) || (b_local.frac._4_1_ == float_class_inf)) {
      hi._4_1_ = '\x03';
    }
    else if ((a_local.frac._4_1_ == float_class_zero) || (b_local.frac._4_1_ == float_class_zero)) {
      hi._4_1_ = '\x01';
    }
    else {
      hi._4_1_ = '\x02';
    }
    if (c_local.frac._4_1_ == float_class_inf) {
      if ((hi._4_1_ == '\x03') && (hi._6_1_ != (c_local.frac._5_1_ & 1))) {
        s->float_exception_flags = s->float_exception_flags | 1;
        join_0x00000010_0x00000000_ = parts_default_nan(s);
      }
      else {
        local_10._4_1_ = 3;
        local_10._0_4_ = (int)a_local.frac;
        local_10._5_1_ = (c_local.frac._5_1_ & 1) != (hi._5_1_ & 1);
        local_10._6_2_ = a_local.frac._6_2_;
        a_local.exp = (int)a_00;
        a_local.cls = (char)(a_00 >> 0x20);
        a_local.sign = (_Bool)(char)(a_00 >> 0x28);
        a_local._14_2_ = (short)(a_00 >> 0x30);
      }
    }
    else if (hi._4_1_ == '\x03') {
      local_10._4_1_ = 3;
      local_10._0_4_ = (int)a_local.frac;
      local_10._5_1_ = hi._6_1_ != (hi._5_1_ & 1);
      local_10._6_2_ = a_local.frac._6_2_;
      a_local.exp = (int)a_00;
      a_local.cls = (char)(a_00 >> 0x20);
      a_local.sign = (_Bool)(char)(a_00 >> 0x28);
      a_local._14_2_ = (short)(a_00 >> 0x30);
    }
    else if (hi._4_1_ == '\x01') {
      if (c_local.frac._4_1_ == float_class_zero) {
        if (hi._6_1_ != (c_local.frac._5_1_ & 1)) {
          hi._6_1_ = s->float_rounding_mode == '\x01';
        }
        c_local.frac._5_1_ = hi._6_1_;
      }
      else if ((flags & 8U) != 0) {
        c_local.frac._0_4_ = (int)c_local.frac + -1;
      }
      local_10._4_1_ = c_local.frac._4_1_;
      local_10._0_4_ = (int)c_local.frac;
      local_10._5_1_ = (c_local.frac._5_1_ & 1) != (hi._5_1_ & 1);
      local_10._6_2_ = c_local.frac._6_2_;
      a_local.exp = uStack_48;
      a_local.cls = p_class;
      a_local.sign = sign_flip;
      a_local._14_2_ = _p_sign;
    }
    else {
      if ((a_local.frac._4_1_ != float_class_normal) || (b_local.frac._4_1_ != float_class_normal))
      {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      c_hi._4_4_ = (int)a_local.frac + (int)b_local.frac;
      mul64To128(a_00,c_local._8_8_,&lo,(uint64_t *)&exp_diff);
      if ((lo & 0x2000000000000000) != 0) {
        shift128RightJamming(lo,_exp_diff,1,&lo,(uint64_t *)&exp_diff);
        c_hi._4_4_ = c_hi._4_4_ + 1;
      }
      if (c_local.frac._4_1_ == float_class_zero) {
        shift128RightJamming(lo,_exp_diff,0x3e,&lo,(uint64_t *)&exp_diff);
      }
      else {
        c_hi._0_4_ = c_hi._4_4_ - (int)c_local.frac;
        if ((hi._6_1_ & 1) == (c_local.frac._5_1_ & 1)) {
          if ((int)c_hi < 1) {
            shift128RightJamming(lo,_exp_diff,0x3e - (int)c_hi,&lo,(uint64_t *)&exp_diff);
            _exp_diff = _uStack_48 + _exp_diff;
            c_hi._4_4_ = (int)c_local.frac;
          }
          else {
            c_lo = _uStack_48 >> 2;
            c_hi_1 = 0;
            shift128RightJamming(c_lo,0,(int)c_hi,&c_lo,&c_hi_1);
            add128(lo,_exp_diff,c_lo,c_hi_1,&lo,(uint64_t *)&exp_diff);
            shift128RightJamming(lo,_exp_diff,0x3e,&lo,(uint64_t *)&exp_diff);
          }
          if ((_exp_diff & 0x8000000000000000) != 0) {
            shift64RightJamming(_exp_diff,1,(uint64_t *)&exp_diff);
            c_hi._4_4_ = c_hi._4_4_ + 1;
          }
        }
        else {
          c_lo_1 = _uStack_48 >> 2;
          uStack_88 = 0;
          if ((int)c_hi < 1) {
            shift128RightJamming(lo,_exp_diff,-(int)c_hi,&lo,(uint64_t *)&exp_diff);
            if (((int)c_hi == 0) && ((c_lo_1 < lo || ((lo == c_lo_1 && (uStack_88 <= _exp_diff))))))
            {
              sub128(lo,_exp_diff,c_lo_1,uStack_88,&lo,(uint64_t *)&exp_diff);
            }
            else {
              sub128(c_lo_1,uStack_88,lo,_exp_diff,&lo,(uint64_t *)&exp_diff);
              hi._6_1_ = (hi._6_1_ & 1) != 1;
              c_hi._4_4_ = (int)c_local.frac;
            }
          }
          else {
            shift128RightJamming(c_lo_1,0,(int)c_hi,&c_lo_1,&stack0xffffffffffffff78);
            sub128(lo,_exp_diff,c_lo_1,uStack_88,&lo,(uint64_t *)&exp_diff);
          }
          if ((lo == 0) && (_exp_diff == 0)) {
            local_10._4_1_ = 1;
            local_10._0_4_ = (int)a_local.frac;
            local_10._5_1_ = (s->float_rounding_mode == '\x01') != (bool)(hi._5_1_ & 1);
            local_10._6_2_ = a_local.frac._6_2_;
            a_local.exp = (int)a_00;
            a_local.cls = (char)(a_00 >> 0x20);
            a_local.sign = (_Bool)(char)(a_00 >> 0x28);
            a_local._14_2_ = (short)(a_00 >> 0x30);
            return stack0xffffffffffffffe8;
          }
          if (lo == 0) {
            local_8c = clz64(_exp_diff);
            local_8c = local_8c + 0x40;
          }
          else {
            local_8c = clz64(lo);
          }
          bVar1 = (byte)(local_8c + -1);
          if (local_8c + -1 < 0x40) {
            _exp_diff = lo << (bVar1 & 0x3f) | _exp_diff >> (0x40 - bVar1 & 0x3f) |
                        (long)(int)(uint)(_exp_diff << (bVar1 & 0x3f) != 0);
          }
          else {
            _exp_diff = _exp_diff << (bVar1 - 0x40 & 0x3f);
          }
          c_hi._4_4_ = c_hi._4_4_ - (local_8c + -3);
        }
      }
      if ((flags & 8U) != 0) {
        c_hi._4_4_ = c_hi._4_4_ + -1;
      }
      local_10._4_1_ = 2;
      local_10._0_4_ = c_hi._4_4_;
      local_10._5_1_ = (hi._6_1_ & 1) != (hi._5_1_ & 1);
      local_10._6_2_ = a_local.frac._6_2_;
      a_local.exp = exp_diff;
      a_local.cls = (undefined1)p_exp;
      a_local.sign = (_Bool)p_exp._1_1_;
      a_local._14_2_ = p_exp._2_2_;
    }
  }
  else {
    s->float_exception_flags = s->float_exception_flags | 1;
    join_0x00000010_0x00000000_ = parts_default_nan(s);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts muladd_floats(FloatParts a, FloatParts b, FloatParts c,
                                int flags, float_status *s)
{
    bool inf_zero = ((1 << a.cls) | (1 << b.cls)) ==
                    ((1 << float_class_inf) | (1 << float_class_zero));
    bool p_sign;
    bool sign_flip = flags & float_muladd_negate_result;
    FloatClass p_class;
    uint64_t hi, lo;
    int p_exp;

    /* It is implementation-defined whether the cases of (0,inf,qnan)
     * and (inf,0,qnan) raise InvalidOperation or not (and what QNaN
     * they return if they do), so we have to hand this information
     * off to the target-specific pick-a-NaN routine.
     */
    if (is_nan(a.cls) || is_nan(b.cls) || is_nan(c.cls)) {
        return pick_nan_muladd(a, b, c, inf_zero, s);
    }

    if (inf_zero) {
        s->float_exception_flags |= float_flag_invalid;
        return parts_default_nan(s);
    }

    if (flags & float_muladd_negate_c) {
        c.sign ^= 1;
    }

    p_sign = a.sign ^ b.sign;

    if (flags & float_muladd_negate_product) {
        p_sign ^= 1;
    }

    if (a.cls == float_class_inf || b.cls == float_class_inf) {
        p_class = float_class_inf;
    } else if (a.cls == float_class_zero || b.cls == float_class_zero) {
        p_class = float_class_zero;
    } else {
        p_class = float_class_normal;
    }

    if (c.cls == float_class_inf) {
        if (p_class == float_class_inf && p_sign != c.sign) {
            s->float_exception_flags |= float_flag_invalid;
            return parts_default_nan(s);
        } else {
            a.cls = float_class_inf;
            a.sign = c.sign ^ sign_flip;
            return a;
        }
    }

    if (p_class == float_class_inf) {
        a.cls = float_class_inf;
        a.sign = p_sign ^ sign_flip;
        return a;
    }

    if (p_class == float_class_zero) {
        if (c.cls == float_class_zero) {
            if (p_sign != c.sign) {
                p_sign = s->float_rounding_mode == float_round_down;
            }
            c.sign = p_sign;
        } else if (flags & float_muladd_halve_result) {
            c.exp -= 1;
        }
        c.sign ^= sign_flip;
        return c;
    }

    /* a & b should be normals now... */
    assert(a.cls == float_class_normal &&
           b.cls == float_class_normal);

    p_exp = a.exp + b.exp;

    /* Multiply of 2 62-bit numbers produces a (2*62) == 124-bit
     * result.
     */
    mul64To128(a.frac, b.frac, &hi, &lo);
    /* binary point now at bit 124 */

    /* check for overflow */
    if (hi & (1ULL << (DECOMPOSED_BINARY_POINT * 2 + 1 - 64))) {
        shift128RightJamming(hi, lo, 1, &hi, &lo);
        p_exp += 1;
    }

    /* + add/sub */
    if (c.cls == float_class_zero) {
        /* move binary point back to 62 */
        shift128RightJamming(hi, lo, DECOMPOSED_BINARY_POINT, &hi, &lo);
    } else {
        int exp_diff = p_exp - c.exp;
        if (p_sign == c.sign) {
            /* Addition */
            if (exp_diff <= 0) {
                shift128RightJamming(hi, lo,
                                     DECOMPOSED_BINARY_POINT - exp_diff,
                                     &hi, &lo);
                lo += c.frac;
                p_exp = c.exp;
            } else {
                uint64_t c_hi, c_lo;
                /* shift c to the same binary point as the product (124) */
                c_hi = c.frac >> 2;
                c_lo = 0;
                shift128RightJamming(c_hi, c_lo,
                                     exp_diff,
                                     &c_hi, &c_lo);
                add128(hi, lo, c_hi, c_lo, &hi, &lo);
                /* move binary point back to 62 */
                shift128RightJamming(hi, lo, DECOMPOSED_BINARY_POINT, &hi, &lo);
            }

            if (lo & DECOMPOSED_OVERFLOW_BIT) {
                shift64RightJamming(lo, 1, &lo);
                p_exp += 1;
            }

        } else {
            /* Subtraction */
            uint64_t c_hi, c_lo;
            /* make C binary point match product at bit 124 */
            c_hi = c.frac >> 2;
            c_lo = 0;

            if (exp_diff <= 0) {
                shift128RightJamming(hi, lo, -exp_diff, &hi, &lo);
                if (exp_diff == 0
                    &&
                    (hi > c_hi || (hi == c_hi && lo >= c_lo))) {
                    sub128(hi, lo, c_hi, c_lo, &hi, &lo);
                } else {
                    sub128(c_hi, c_lo, hi, lo, &hi, &lo);
                    p_sign ^= 1;
                    p_exp = c.exp;
                }
            } else {
                shift128RightJamming(c_hi, c_lo,
                                     exp_diff,
                                     &c_hi, &c_lo);
                sub128(hi, lo, c_hi, c_lo, &hi, &lo);
            }

            if (hi == 0 && lo == 0) {
                a.cls = float_class_zero;
                a.sign = s->float_rounding_mode == float_round_down;
                a.sign ^= sign_flip;
                return a;
            } else {
                int shift;
                if (hi != 0) {
                    shift = clz64(hi);
                } else {
                    shift = clz64(lo) + 64;
                }
                /* Normalizing to a binary point of 124 is the
                   correct adjust for the exponent.  However since we're
                   shifting, we might as well put the binary point back
                   at 62 where we really want it.  Therefore shift as
                   if we're leaving 1 bit at the top of the word, but
                   adjust the exponent as if we're leaving 3 bits.  */
                shift -= 1;
                if (shift >= 64) {
                    lo = lo << (shift - 64);
                } else {
                    hi = (hi << shift) | (lo >> (64 - shift));
                    lo = hi | ((lo << shift) != 0);
                }
                p_exp -= shift - 2;
            }
        }
    }

    if (flags & float_muladd_halve_result) {
        p_exp -= 1;
    }

    /* finally prepare our result */
    a.cls = float_class_normal;
    a.sign = p_sign ^ sign_flip;
    a.exp = p_exp;
    a.frac = lo;

    return a;
}